

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O3

void dump_history(ang_file *file)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  history_info *history_list_local;
  char buf [120];
  history_info *local_b0;
  char local_a8 [120];
  
  local_b0 = (history_info *)0x0;
  sVar2 = history_get_list(player,&local_b0);
  file_putf(file,"[Player history]\n");
  file_putf(file,"      Turn   Depth  Note\n");
  if (sVar2 != 0) {
    lVar3 = 0;
    do {
      strnfmt(local_a8,0x78,"%10ld%7d\'  %s",(long)*(int *)(local_b0->event + lVar3 + -4),
              (ulong)(uint)(*(short *)(local_b0->type + lVar3 + 2) * 0x32));
      _Var1 = flag_has_dbg(local_b0->type + lVar3,2,4,"history_list_local[i].type",
                           "HIST_ARTIFACT_LOST");
      if (_Var1) {
        my_strcat(local_a8," (LOST)",0x78);
      }
      file_putf(file,"%s",local_a8);
      file_put(file,"\n");
      lVar3 = lVar3 + 0x5c;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void dump_history(ang_file *file)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	size_t i;
	char buf[120];

	file_putf(file, "[Player history]\n");
	file_putf(file, "      Turn   Depth  Note\n");

	for (i = 0; i < max_item; i++) {
		strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

		if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
			my_strcat(buf, " (LOST)", sizeof(buf));

		file_putf(file, "%s", buf);
		file_put(file, "\n");
	}

	return;
}